

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void com_get_nbr_c(pel *dst,int ipm_c,int ipm,int x,int y,int width,int height,pel *srcT,pel *srcL,
                  int s_src,u16 avail_cu,int scup,com_scu_t *map_scu,int i_scu,int bit_depth)

{
  pel *ppVar1;
  undefined2 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pel pVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  pel *ppVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  pel *ppVar19;
  com_scu_t *pcVar20;
  int __c;
  s16 *pdst;
  size_t __n;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar59;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar60;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  
  __c = 1 << ((char)bit_depth - 1U & 0x1f);
  iVar15 = height;
  if (height < width) {
    iVar15 = width;
  }
  iVar15 = iVar15 * 2 + 4;
  if ((ipm_c != 2) && (ipm_c != 0 || ipm < 0x18)) {
    ppVar19 = dst + 2;
    if ((avail_cu & 1) == 0) {
      memset(ppVar19,__c,(long)(iVar15 * 2));
    }
    else {
      uVar16 = width >> 1;
      __n = (size_t)(width * 2);
      memcpy(ppVar19,srcT,__n);
      ppVar19 = ppVar19 + __n;
      if ((int)uVar16 < 1) {
        iVar11 = 0;
      }
      else {
        lVar12 = 0;
        do {
          if (((byte)map_scu[lVar12 + (ulong)uVar16 + ((long)scup - (long)i_scu)] & 1) == 0) {
            uVar16 = (uint)lVar12;
            break;
          }
          *(undefined4 *)ppVar19 = *(undefined4 *)(srcT + lVar12 * 4 + __n);
          ppVar19 = ppVar19 + 4;
          lVar12 = lVar12 + 1;
        } while ((uint)lVar12 != uVar16);
        iVar11 = uVar16 * 2;
      }
      auVar9 = _DAT_00163a40;
      uVar16 = iVar15 - (iVar11 + width);
      if (0 < (int)uVar16) {
        uVar2 = *(undefined2 *)(ppVar19 + -2);
        lVar12 = (ulong)uVar16 - 1;
        auVar39._8_4_ = (int)lVar12;
        auVar39._0_8_ = lVar12;
        auVar39._12_4_ = (int)((ulong)lVar12 >> 0x20);
        uVar13 = 0;
        auVar39 = auVar39 ^ _DAT_00163a40;
        auVar34 = _DAT_00163a00;
        auVar63 = _DAT_00163a10;
        auVar67 = _DAT_00163a20;
        auVar38 = _DAT_00163a30;
        do {
          auVar51 = auVar38 ^ auVar9;
          iVar11 = auVar39._0_4_;
          iVar60 = -(uint)(iVar11 < auVar51._0_4_);
          iVar17 = auVar39._4_4_;
          auVar26._4_4_ = -(uint)(iVar17 < auVar51._4_4_);
          iVar18 = auVar39._8_4_;
          iVar59 = -(uint)(iVar18 < auVar51._8_4_);
          iVar54 = auVar39._12_4_;
          auVar26._12_4_ = -(uint)(iVar54 < auVar51._12_4_);
          auVar46._4_4_ = iVar60;
          auVar46._0_4_ = iVar60;
          auVar46._8_4_ = iVar59;
          auVar46._12_4_ = iVar59;
          auVar61 = pshuflw(in_XMM11,auVar46,0xe8);
          auVar28._4_4_ = -(uint)(auVar51._4_4_ == iVar17);
          auVar28._12_4_ = -(uint)(auVar51._12_4_ == iVar54);
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar66 = pshuflw(in_XMM12,auVar28,0xe8);
          auVar26._0_4_ = auVar26._4_4_;
          auVar26._8_4_ = auVar26._12_4_;
          auVar62 = pshuflw(auVar61,auVar26,0xe8);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar62 | auVar66 & auVar61) ^ auVar51;
          auVar51 = packssdw(auVar51,auVar51);
          if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(ppVar19 + uVar13 * 2) = uVar2;
          }
          auVar26 = auVar28 & auVar46 | auVar26;
          auVar51 = packssdw(auVar26,auVar26);
          auVar62._8_4_ = 0xffffffff;
          auVar62._0_8_ = 0xffffffffffffffff;
          auVar62._12_4_ = 0xffffffff;
          auVar51 = packssdw(auVar51 ^ auVar62,auVar51 ^ auVar62);
          if ((auVar51._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)(ppVar19 + uVar13 * 2 + 2) = uVar2;
          }
          auVar51 = auVar67 ^ auVar9;
          iVar60 = -(uint)(iVar11 < auVar51._0_4_);
          auVar55._4_4_ = -(uint)(iVar17 < auVar51._4_4_);
          iVar59 = -(uint)(iVar18 < auVar51._8_4_);
          auVar55._12_4_ = -(uint)(iVar54 < auVar51._12_4_);
          auVar27._4_4_ = iVar60;
          auVar27._0_4_ = iVar60;
          auVar27._8_4_ = iVar59;
          auVar27._12_4_ = iVar59;
          auVar45._4_4_ = -(uint)(auVar51._4_4_ == iVar17);
          auVar45._12_4_ = -(uint)(auVar51._12_4_ == iVar54);
          auVar45._0_4_ = auVar45._4_4_;
          auVar45._8_4_ = auVar45._12_4_;
          auVar55._0_4_ = auVar55._4_4_;
          auVar55._8_4_ = auVar55._12_4_;
          auVar51 = auVar45 & auVar27 | auVar55;
          auVar51 = packssdw(auVar51,auVar51);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar51 = packssdw(auVar51 ^ auVar7,auVar51 ^ auVar7);
          if ((auVar51 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(ppVar19 + uVar13 * 2 + 4) = uVar2;
          }
          auVar28 = pshufhw(auVar27,auVar27,0x84);
          auVar46 = pshufhw(auVar45,auVar45,0x84);
          auVar26 = pshufhw(auVar28,auVar55,0x84);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar29 = (auVar26 | auVar46 & auVar28) ^ auVar29;
          auVar28 = packssdw(auVar29,auVar29);
          if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(ppVar19 + uVar13 * 2 + 6) = uVar2;
          }
          auVar28 = auVar63 ^ auVar9;
          iVar60 = -(uint)(iVar11 < auVar28._0_4_);
          auVar31._4_4_ = -(uint)(iVar17 < auVar28._4_4_);
          iVar59 = -(uint)(iVar18 < auVar28._8_4_);
          auVar31._12_4_ = -(uint)(iVar54 < auVar28._12_4_);
          auVar47._4_4_ = iVar60;
          auVar47._0_4_ = iVar60;
          auVar47._8_4_ = iVar59;
          auVar47._12_4_ = iVar59;
          auVar51 = pshuflw(auVar51,auVar47,0xe8);
          auVar30._4_4_ = -(uint)(auVar28._4_4_ == iVar17);
          auVar30._12_4_ = -(uint)(auVar28._12_4_ == iVar54);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar28 = pshuflw(auVar66 & auVar61,auVar30,0xe8);
          in_XMM12 = auVar28 & auVar51;
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar51 = pshuflw(auVar51,auVar31,0xe8);
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0xffffffffffffffff;
          auVar61._12_4_ = 0xffffffff;
          auVar61 = (auVar51 | in_XMM12) ^ auVar61;
          auVar51 = packssdw(auVar61,auVar61);
          if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(ppVar19 + uVar13 * 2 + 8) = uVar2;
          }
          auVar31 = auVar30 & auVar47 | auVar31;
          auVar51 = packssdw(auVar31,auVar31);
          auVar66._8_4_ = 0xffffffff;
          auVar66._0_8_ = 0xffffffffffffffff;
          auVar66._12_4_ = 0xffffffff;
          auVar51 = packssdw(auVar51 ^ auVar66,auVar51 ^ auVar66);
          if ((auVar51 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)(ppVar19 + uVar13 * 2 + 10) = uVar2;
          }
          auVar51 = auVar34 ^ auVar9;
          iVar11 = -(uint)(iVar11 < auVar51._0_4_);
          auVar56._4_4_ = -(uint)(iVar17 < auVar51._4_4_);
          iVar18 = -(uint)(iVar18 < auVar51._8_4_);
          auVar56._12_4_ = -(uint)(iVar54 < auVar51._12_4_);
          auVar32._4_4_ = iVar11;
          auVar32._0_4_ = iVar11;
          auVar32._8_4_ = iVar18;
          auVar32._12_4_ = iVar18;
          auVar48._4_4_ = -(uint)(auVar51._4_4_ == iVar17);
          auVar48._12_4_ = -(uint)(auVar51._12_4_ == iVar54);
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar51 = auVar48 & auVar32 | auVar56;
          auVar51 = packssdw(auVar51,auVar51);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          in_XMM11 = packssdw(auVar51 ^ auVar8,auVar51 ^ auVar8);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(ppVar19 + uVar13 * 2 + 0xc) = uVar2;
          }
          auVar51 = pshufhw(auVar32,auVar32,0x84);
          auVar26 = pshufhw(auVar48,auVar48,0x84);
          auVar28 = pshufhw(auVar51,auVar56,0x84);
          auVar33._8_4_ = 0xffffffff;
          auVar33._0_8_ = 0xffffffffffffffff;
          auVar33._12_4_ = 0xffffffff;
          auVar33 = (auVar28 | auVar26 & auVar51) ^ auVar33;
          auVar51 = packssdw(auVar33,auVar33);
          if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(ppVar19 + uVar13 * 2 + 0xe) = uVar2;
          }
          uVar13 = uVar13 + 8;
          lVar12 = auVar38._8_8_;
          auVar38._0_8_ = auVar38._0_8_ + 8;
          auVar38._8_8_ = lVar12 + 8;
          lVar12 = auVar67._8_8_;
          auVar67._0_8_ = auVar67._0_8_ + 8;
          auVar67._8_8_ = lVar12 + 8;
          lVar12 = auVar63._8_8_;
          auVar63._0_8_ = auVar63._0_8_ + 8;
          auVar63._8_8_ = lVar12 + 8;
          lVar12 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 8;
          auVar34._8_8_ = lVar12 + 8;
        } while ((uVar16 + 7 & 0xfffffff8) != uVar13);
      }
    }
    if ((ipm_c == 3) || (ipm_c == 0 && 0xfffffff5 < ipm - 0xdU)) goto LAB_001190bc;
  }
  ppVar19 = dst + -2;
  if ((avail_cu & 2) == 0) {
    memset(ppVar19 + (2 - (long)(iVar15 * 2)),__c,(long)(iVar15 * 2));
  }
  else {
    iVar11 = height >> 1;
    lVar12 = (long)s_src;
    ppVar14 = srcL;
    if (0 < height) {
      iVar17 = 0;
      do {
        *(undefined2 *)ppVar19 = *(undefined2 *)ppVar14;
        ppVar1 = ppVar14 + lVar12;
        ppVar14 = ppVar14 + lVar12 * 2;
        *(undefined2 *)(ppVar19 + -2) = *(undefined2 *)ppVar1;
        ppVar19 = ppVar19 + -4;
        iVar17 = iVar17 + 2;
      } while (iVar17 < height);
    }
    if (iVar11 < 1) {
      iVar17 = 0;
    }
    else {
      pcVar20 = map_scu + (long)(iVar11 * i_scu) + (long)scup + -1;
      iVar18 = 0;
      do {
        iVar17 = iVar18;
        if (((byte)*pcVar20 & 1) == 0) break;
        *(undefined2 *)ppVar19 = *(undefined2 *)ppVar14;
        ppVar1 = ppVar14 + lVar12;
        ppVar14 = ppVar14 + lVar12 * 2;
        *(undefined2 *)(ppVar19 + -2) = *(undefined2 *)ppVar1;
        ppVar19 = ppVar19 + -4;
        iVar18 = iVar18 + 1;
        pcVar20 = pcVar20 + i_scu;
        iVar17 = iVar11;
      } while (iVar11 != iVar18);
      iVar17 = iVar17 * 2;
    }
    auVar9 = _DAT_00163a40;
    uVar16 = iVar15 - (iVar17 + height);
    if (0 < (int)uVar16) {
      uVar2 = *(undefined2 *)(ppVar19 + 2);
      lVar12 = (ulong)uVar16 - 1;
      auVar21._8_4_ = (int)lVar12;
      auVar21._0_8_ = lVar12;
      auVar21._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar13 = 0;
      auVar21 = auVar21 ^ _DAT_00163a40;
      auVar22 = _DAT_00163a00;
      auVar23 = _DAT_00163a10;
      auVar24 = _DAT_00163a20;
      auVar25 = _DAT_00163a30;
      do {
        auVar34 = auVar25 ^ auVar9;
        iVar15 = auVar21._0_4_;
        iVar54 = -(uint)(iVar15 < auVar34._0_4_);
        iVar11 = auVar21._4_4_;
        auVar36._4_4_ = -(uint)(iVar11 < auVar34._4_4_);
        iVar17 = auVar21._8_4_;
        iVar60 = -(uint)(iVar17 < auVar34._8_4_);
        iVar18 = auVar21._12_4_;
        auVar36._12_4_ = -(uint)(iVar18 < auVar34._12_4_);
        auVar49._4_4_ = iVar54;
        auVar49._0_4_ = iVar54;
        auVar49._8_4_ = iVar60;
        auVar49._12_4_ = iVar60;
        auVar63 = pshuflw(in_XMM11,auVar49,0xe8);
        auVar35._4_4_ = -(uint)(auVar34._4_4_ == iVar11);
        auVar35._12_4_ = -(uint)(auVar34._12_4_ == iVar18);
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar67 = pshuflw(in_XMM12,auVar35,0xe8);
        auVar36._0_4_ = auVar36._4_4_;
        auVar36._8_4_ = auVar36._12_4_;
        auVar34 = pshuflw(auVar63,auVar36,0xe8);
        auVar64._8_4_ = 0xffffffff;
        auVar64._0_8_ = 0xffffffffffffffff;
        auVar64._12_4_ = 0xffffffff;
        auVar64 = (auVar34 | auVar67 & auVar63) ^ auVar64;
        auVar34 = packssdw(auVar64,auVar64);
        if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)(ppVar19 + uVar13 * 2 + (2 - (long)(int)(uVar16 * 2))) = uVar2;
        }
        auVar36 = auVar35 & auVar49 | auVar36;
        auVar34 = packssdw(auVar36,auVar36);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar3,auVar34 ^ auVar3);
        if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
          *(undefined2 *)(ppVar19 + uVar13 * 2 + (4 - (long)(int)(uVar16 * 2))) = uVar2;
        }
        auVar34 = auVar24 ^ auVar9;
        iVar54 = -(uint)(iVar15 < auVar34._0_4_);
        auVar57._4_4_ = -(uint)(iVar11 < auVar34._4_4_);
        iVar60 = -(uint)(iVar17 < auVar34._8_4_);
        auVar57._12_4_ = -(uint)(iVar18 < auVar34._12_4_);
        auVar37._4_4_ = iVar54;
        auVar37._0_4_ = iVar54;
        auVar37._8_4_ = iVar60;
        auVar37._12_4_ = iVar60;
        auVar50._4_4_ = -(uint)(auVar34._4_4_ == iVar11);
        auVar50._12_4_ = -(uint)(auVar34._12_4_ == iVar18);
        auVar50._0_4_ = auVar50._4_4_;
        auVar50._8_4_ = auVar50._12_4_;
        auVar57._0_4_ = auVar57._4_4_;
        auVar57._8_4_ = auVar57._12_4_;
        auVar34 = auVar50 & auVar37 | auVar57;
        auVar34 = packssdw(auVar34,auVar34);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar4,auVar34 ^ auVar4);
        if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(ppVar19 + uVar13 * 2 + (6 - (long)(int)(uVar16 * 2))) = uVar2;
        }
        auVar38 = pshufhw(auVar37,auVar37,0x84);
        auVar51 = pshufhw(auVar50,auVar50,0x84);
        auVar39 = pshufhw(auVar38,auVar57,0x84);
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar40 = (auVar39 | auVar51 & auVar38) ^ auVar40;
        auVar38 = packssdw(auVar40,auVar40);
        if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(ppVar19 + uVar13 * 2 + (8 - (long)(int)(uVar16 * 2))) = uVar2;
        }
        auVar38 = auVar23 ^ auVar9;
        iVar54 = -(uint)(iVar15 < auVar38._0_4_);
        auVar42._4_4_ = -(uint)(iVar11 < auVar38._4_4_);
        iVar60 = -(uint)(iVar17 < auVar38._8_4_);
        auVar42._12_4_ = -(uint)(iVar18 < auVar38._12_4_);
        auVar52._4_4_ = iVar54;
        auVar52._0_4_ = iVar54;
        auVar52._8_4_ = iVar60;
        auVar52._12_4_ = iVar60;
        auVar34 = pshuflw(auVar34,auVar52,0xe8);
        auVar41._4_4_ = -(uint)(auVar38._4_4_ == iVar11);
        auVar41._12_4_ = -(uint)(auVar38._12_4_ == iVar18);
        auVar41._0_4_ = auVar41._4_4_;
        auVar41._8_4_ = auVar41._12_4_;
        auVar63 = pshuflw(auVar67 & auVar63,auVar41,0xe8);
        in_XMM12 = auVar63 & auVar34;
        auVar42._0_4_ = auVar42._4_4_;
        auVar42._8_4_ = auVar42._12_4_;
        auVar34 = pshuflw(auVar34,auVar42,0xe8);
        auVar65._8_4_ = 0xffffffff;
        auVar65._0_8_ = 0xffffffffffffffff;
        auVar65._12_4_ = 0xffffffff;
        auVar65 = (auVar34 | in_XMM12) ^ auVar65;
        auVar34 = packssdw(auVar65,auVar65);
        if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)(ppVar19 + uVar13 * 2 + (10 - (long)(int)(uVar16 * 2))) = uVar2;
        }
        auVar42 = auVar41 & auVar52 | auVar42;
        auVar34 = packssdw(auVar42,auVar42);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar5,auVar34 ^ auVar5);
        if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined2 *)(ppVar19 + uVar13 * 2 + (0xc - (long)(int)(uVar16 * 2))) = uVar2;
        }
        auVar34 = auVar22 ^ auVar9;
        iVar15 = -(uint)(iVar15 < auVar34._0_4_);
        auVar58._4_4_ = -(uint)(iVar11 < auVar34._4_4_);
        iVar17 = -(uint)(iVar17 < auVar34._8_4_);
        auVar58._12_4_ = -(uint)(iVar18 < auVar34._12_4_);
        auVar43._4_4_ = iVar15;
        auVar43._0_4_ = iVar15;
        auVar43._8_4_ = iVar17;
        auVar43._12_4_ = iVar17;
        auVar53._4_4_ = -(uint)(auVar34._4_4_ == iVar11);
        auVar53._12_4_ = -(uint)(auVar34._12_4_ == iVar18);
        auVar53._0_4_ = auVar53._4_4_;
        auVar53._8_4_ = auVar53._12_4_;
        auVar58._0_4_ = auVar58._4_4_;
        auVar58._8_4_ = auVar58._12_4_;
        auVar34 = auVar53 & auVar43 | auVar58;
        auVar34 = packssdw(auVar34,auVar34);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar34 ^ auVar6,auVar34 ^ auVar6);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(ppVar19 + uVar13 * 2 + (0xe - (long)(int)(uVar16 * 2))) = uVar2;
        }
        auVar34 = pshufhw(auVar43,auVar43,0x84);
        auVar67 = pshufhw(auVar53,auVar53,0x84);
        auVar63 = pshufhw(auVar34,auVar58,0x84);
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar44 = (auVar63 | auVar67 & auVar34) ^ auVar44;
        auVar34 = packssdw(auVar44,auVar44);
        if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(ppVar19 + uVar13 * 2 + (0x10 - (long)(int)(uVar16 * 2))) = uVar2;
        }
        uVar13 = uVar13 + 8;
        lVar12 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 8;
        auVar25._8_8_ = lVar12 + 8;
        lVar12 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 8;
        auVar24._8_8_ = lVar12 + 8;
        lVar12 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 8;
        auVar23._8_8_ = lVar12 + 8;
        lVar12 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 8;
        auVar22._8_8_ = lVar12 + 8;
      } while ((uVar16 + 7 & 0xfffffff8) != uVar13);
    }
  }
LAB_001190bc:
  if ((avail_cu & 4) == 0) {
    if ((avail_cu & 1) == 0) {
      if ((avail_cu & 2) == 0) {
        dst[1] = (pel)__c;
        *dst = (pel)__c;
        return;
      }
      *dst = *srcL;
      pVar10 = srcL[1];
    }
    else {
      *dst = *srcT;
      pVar10 = srcT[1];
    }
  }
  else {
    *dst = srcT[-2];
    pVar10 = srcT[-1];
  }
  dst[1] = pVar10;
  return;
}

Assistant:

void com_get_nbr_c(pel *dst, int ipm_c, int ipm, int x, int y, int width, int height, pel *srcT, pel *srcL, int s_src, u16 avail_cu, int scup, com_scu_t * map_scu, int i_scu, int bit_depth)
{
    int  i;
    int  width_in_scu = width >> (MIN_CU_LOG2 - 1);
    int  height_in_scu = height >> (MIN_CU_LOG2 - 1);
    pel *srcTL = srcT - 2;
    pel *up   = dst + 2;
    pel *left = dst - 2;

    int pad_le_in_scu = height_in_scu;
    int pad_up_in_scu = width_in_scu;

    int width2 = width << 1;
    int height2 = height << 1;
    int default_val = 1 << (bit_depth - 1);
    int pad_range = COM_MAX(width, height) * 2 + 4;

    if (ipm_c != IPD_HOR_C && (ipm_c != IPD_DM_C || ipm < IPD_HOR)) {
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            com_scu_t *map_up_scu = map_scu + scup - i_scu + width_in_scu;

            memcpy(up, srcT, width2 * sizeof(pel));
            up += width2, srcT += width2;

            for (i = 0; i < pad_up_in_scu; i++, up += MIN_CU_SIZE, srcT += MIN_CU_SIZE) {
                if ((map_up_scu++)->coded) {
                    com_mcpy_4pel(up, srcT);
                } else {
                    break;
                }
            }
            const int shift = sizeof(pel) * 8;
            int uv_pixel = (up[-1] << shift) + up[-2];
            com_mset_2pel(up, uv_pixel, pad_range - (width + i * MIN_CU_SIZE / 2));
        } else {
            com_mset_pel(up, default_val, pad_range << 1);
        }
    }
    if (ipm_c != IPD_VER_C && (ipm_c != IPD_DM_C || ipm <= IPD_BI || ipm > IPD_VER)) {
        if (IS_AVAIL(avail_cu, AVAIL_LE)) {
            com_scu_t *map_left_scu = map_scu + scup - 1 + height_in_scu * i_scu;
            pel *src = srcL;

            for (i = 0; i < height; i+=2) {
                com_mcpy_2pel(left, src); src += s_src; left -= 2;
                com_mcpy_2pel(left, src); src += s_src; left -= 2;
            }
            for (i = 0; i < pad_le_in_scu; i++, map_left_scu += i_scu) {
                if (map_left_scu->coded) {
                    com_mcpy_2pel(left, src); src += s_src; left -= 2;
                    com_mcpy_2pel(left, src); src += s_src; left -= 2;
                } else {
                    break;
                }
            }

            const int shift = sizeof(pel) * 8;
            int uv_pixel = (left[3] << shift) + left[2];
            int pads = pad_range - height - i * MIN_CU_SIZE / 2;
            com_mset_2pel(left - pads * 2 + 2, uv_pixel, pads);
        } else {
            com_mset_pel(left - (pad_range << 1) + 2, default_val, pad_range << 1);
        }
    }
    if (IS_AVAIL(avail_cu, AVAIL_UL)) {
        dst[0] = srcTL[0];
        dst[1] = srcTL[1];
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        dst[0] = srcTL[2];
        dst[1] = srcTL[3];
    } else if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        dst[0] = srcL[0];
        dst[1] = srcL[1];
    } else {
        dst[0] = dst[1] = default_val;
    }
}